

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcUtil.c
# Opt level: O1

void Abc_NtkReverseTopoOrder_rec(Abc_Obj_t *pObj,int fThisIsPivot)

{
  int iVar1;
  int iVar2;
  Abc_Ntk_t *pAVar3;
  Abc_Ntk_t *pAVar4;
  Vec_Int_t *pVVar5;
  int *piVar6;
  Abc_Obj_t *pObj_00;
  uint uVar7;
  long lVar8;
  int in_EDX;
  int Fill;
  long lVar9;
  Abc_Obj_t *pObj_01;
  
  pAVar3 = pObj->pNtk;
  iVar1 = pObj->Id;
  Vec_IntFillExtra(&pAVar3->vTravIds,iVar1 + 1,in_EDX);
  if (((long)iVar1 < 0) || ((pAVar3->vTravIds).nSize <= iVar1)) {
LAB_0088163c:
    __assert_fail("i >= 0 && i < p->nSize",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                  ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
  }
  pAVar4 = pObj->pNtk;
  iVar2 = pAVar4->nTravIds;
  if ((pAVar3->vTravIds).pArray[iVar1] == iVar2) {
    return;
  }
  iVar1 = pObj->Id;
  Vec_IntFillExtra(&pAVar4->vTravIds,iVar1 + 1,Fill);
  if (((long)iVar1 < 0) || ((pAVar4->vTravIds).nSize <= iVar1)) goto LAB_0088165b;
  (pAVar4->vTravIds).pArray[iVar1] = iVar2;
  uVar7 = *(uint *)&pObj->field_0x14 & 0xf;
  if (uVar7 != 3) {
    if (uVar7 != 7) {
      __assert_fail("Abc_ObjIsNode(pObj)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abc/abcUtil.c"
                    ,0xa51,"void Abc_NtkReverseTopoOrder_rec(Abc_Obj_t *, int)");
    }
    if (fThisIsPivot != 0) {
      uVar7 = pObj->Id * 2;
      if ((int)uVar7 < 0) goto LAB_0088165b;
      pVVar5 = pObj->pNtk->vTopo;
      iVar1 = pVVar5->nSize;
      if (iVar1 <= (int)uVar7) goto LAB_0088165b;
      pVVar5->pArray[uVar7] = iVar1;
    }
    lVar8 = (long)(pObj->vFanouts).nSize;
    if (0 < lVar8) {
      lVar9 = 0;
      do {
        pObj_01 = (Abc_Obj_t *)pObj->pNtk->vObjs->pArray[(pObj->vFanouts).pArray[lVar9]];
        uVar7 = pObj_01->Id * 2;
        if ((int)uVar7 < 0) goto LAB_0088163c;
        pVVar5 = pObj_01->pNtk->vTopo;
        iVar1 = pVVar5->nSize;
        if (iVar1 <= (int)uVar7) goto LAB_0088163c;
        piVar6 = pVVar5->pArray;
        if (piVar6[uVar7] == 0) {
          if (iVar1 <= (int)(uVar7 | 1)) goto LAB_0088163c;
          if (piVar6[uVar7 | 1] != 0) {
            __assert_fail("!Abc_NtkTopoHasEnd(pNext)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abc/abcUtil.c"
                          ,0xa59,"void Abc_NtkReverseTopoOrder_rec(Abc_Obj_t *, int)");
          }
          Abc_NtkReverseTopoOrder_rec(pObj_01,1);
          goto LAB_008815bc;
        }
        lVar9 = lVar9 + 1;
      } while (lVar8 != lVar9);
    }
    pObj_01 = (Abc_Obj_t *)0x0;
LAB_008815bc:
    if (0 < (pObj->vFanouts).nSize) {
      lVar8 = 0;
      do {
        pObj_00 = (Abc_Obj_t *)pObj->pNtk->vObjs->pArray[(pObj->vFanouts).pArray[lVar8]];
        if (pObj_00 != pObj_01) {
          Abc_NtkReverseTopoOrder_rec(pObj_00,0);
        }
        lVar8 = lVar8 + 1;
      } while (lVar8 < (pObj->vFanouts).nSize);
    }
    if (fThisIsPivot != 0) {
      if (-1 < pObj->Id * 2) {
        pVVar5 = pObj->pNtk->vTopo;
        uVar7 = pObj->Id * 2 + 1;
        iVar1 = pVVar5->nSize;
        if ((int)uVar7 < iVar1) {
          pVVar5->pArray[uVar7] = iVar1;
          goto LAB_00881622;
        }
      }
LAB_0088165b:
      __assert_fail("i >= 0 && i < p->nSize",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                    ,0x1cb,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
    }
  }
LAB_00881622:
  Vec_IntPush(pObj->pNtk->vTopo,pObj->Id);
  return;
}

Assistant:

void Abc_NtkReverseTopoOrder_rec( Abc_Obj_t * pObj, int fThisIsPivot )
{
    Abc_Obj_t * pNext, * pPivot = NULL;
    int i;
    if ( Abc_NodeIsTravIdCurrent( pObj ) )
        return;
    Abc_NodeSetTravIdCurrent( pObj );
    if ( Abc_ObjIsPo(pObj) )
    {
        Vec_IntPush( pObj->pNtk->vTopo, Abc_ObjId(pObj) );
        return;
    }
    assert( Abc_ObjIsNode(pObj) );
    // mark begining
    if ( fThisIsPivot )
        Abc_NtkTopoSetBeg( pObj );        
    // find fanout without topo
    Abc_ObjForEachFanout( pObj, pNext, i )
        if ( !Abc_NtkTopoHasBeg(pNext) )
        { 
            assert( !Abc_NtkTopoHasEnd(pNext) );
            Abc_NtkReverseTopoOrder_rec( pNext, 1 );
            pPivot = pNext;
            break;
        }
    Abc_ObjForEachFanout( pObj, pNext, i )
        if ( pNext != pPivot )
            Abc_NtkReverseTopoOrder_rec( pNext, 0 );
    // mark end
    if ( fThisIsPivot )
        Abc_NtkTopoSetEnd( pObj );
    // save current node        
    Vec_IntPush( pObj->pNtk->vTopo, Abc_ObjId(pObj) );
}